

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

err_t CallCreate(nodecontext *p,node *Node,nodeclass *Class)

{
  byte bVar1;
  err_t eVar2;
  long lVar3;
  nodemeta *i;
  
  if (Class != (nodeclass *)0x0) {
    if (Class->ParentId != 0 && Class->ParentClass == (nodeclass *)0x0) {
      return -5;
    }
    eVar2 = CallCreate(p,Node,Class->ParentClass);
    if (eVar2 != 0) {
      return -5;
    }
    i = Class->Meta;
    if ((i == (nodemeta *)0x0) || (Class->State < '\x01')) {
      __assert_fail("Class->Meta && Class->State>=CLASS_INITED",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x318,"err_t CallCreate(nodecontext *, node *, const nodeclass *)");
    }
    for (; bVar1 = *(byte *)i, bVar1 != 0; i = i + 1) {
      if ((bVar1 & 0xc0) == 0x80) {
        MetaConst(i,Node);
      }
      else if (bVar1 == 0xd) {
        lVar3 = (*(code *)i->Data)(Node);
        if (lVar3 != 0) {
          CallDelete(p,Node,Class->ParentClass);
          return -5;
        }
      }
      else if ((bVar1 == 0x5e) && (-1 < (long)i->Data)) {
        ArrayInitEx((array *)((long)&Node->FourCC + i->Data),p->NodeHeap);
      }
    }
  }
  return 0;
}

Assistant:

static err_t CallCreate(nodecontext* p,node* Node,const nodeclass* Class)
{
    if (Class)
    {
        const nodemeta* i;

        if (Class->ParentId && !Class->ParentClass)
            return ERR_NOT_SUPPORTED;

        if (CallCreate(p,Node,Class->ParentClass)!=ERR_NONE)
            return ERR_NOT_SUPPORTED;

        assert(Class->Meta && Class->State>=CLASS_INITED);

        for (i=Class->Meta;i->Meta != META_CLASS_PARENT_ID;++i)
        {
            if ((i->Meta & META_MODE_MASK)==META_MODE_CONST)
                MetaConst(i,Node);
            else
            if (i->Meta == (META_MODE_DATA | TYPE_ARRAY) && (intptr_t)i->Data>=0)
            {
                array* Ptr = (void*)((uint8_t*)Node+i->Data);
                ArrayInitEx(Ptr,p->NodeHeap);
            }
            else
            if (i->Meta == META_CLASS_CREATE && ((err_t(*)(node*))i->Data)(Node) != ERR_NONE)
            {
                CallDelete(p,Node,Class->ParentClass);
                return ERR_NOT_SUPPORTED;
            }
        }
    }
    return ERR_NONE;
}